

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

Result __thiscall wabt::TypeChecker::DropTypes(TypeChecker *this,size_t drop_count)

{
  Result RVar1;
  Enum EVar2;
  Label *label;
  Label *local_20;
  
  RVar1 = GetLabel(this,0,&local_20);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    if ((ulong)((long)(this->type_stack_).
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->type_stack_).
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <
        local_20->type_stack_limit + drop_count) {
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
                (&this->type_stack_,local_20->type_stack_limit);
      EVar2 = local_20->unreachable ^ Error;
    }
    else {
      EVar2 = Ok;
      if ((drop_count != 0) && ((drop_count & 0x3fffffffffffffff) != 0)) {
        (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
             .super__Vector_impl_data._M_finish + -drop_count;
      }
    }
  }
  return (Result)EVar2;
}

Assistant:

Result TypeChecker::DropTypes(size_t drop_count) {
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  if (label->type_stack_limit + drop_count > type_stack_.size()) {
    ResetTypeStackToLabel(label);
    return label->unreachable ? Result::Ok : Result::Error;
  }
  type_stack_.erase(type_stack_.end() - drop_count, type_stack_.end());
  return Result::Ok;
}